

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O3

void __thiscall
chrono::copter::Copter<6>::AddVisualizationAssets
          (Copter<6> *this,string *chassismesh,string *propellermesh,ChFrame<double> *cor_m1,
          ChFrame<double> *cor_m2)

{
  element_type *peVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar3;
  ChColor *pCVar4;
  string *size;
  pointer psVar5;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_prop_shape;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> prop_trimesh;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  ChColor *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  ChColor *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  undefined8 local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  ChColor *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  ChFrame<double> *local_50;
  string *local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_50 = cor_m2;
  local_48 = propellermesh;
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&local_a8,SUB81(chassismesh,0),true);
  pCVar4 = (ChColor *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)chassismesh);
  chrono::ChTriangleMeshShape::ChTriangleMeshShape((ChTriangleMeshShape *)pCVar4);
  local_c8 = pCVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (&_Stack_c0,(ChTriangleMeshShape *)pCVar4);
  local_68 = local_a8;
  p_Stack_60 = p_Stack_a0;
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_a0->_M_use_count = p_Stack_a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_a0->_M_use_count = p_Stack_a0->_M_use_count + 1;
    }
  }
  chrono::ChTriangleMeshShape::SetMesh(local_c8,&local_68,1);
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  *(undefined1 *)((long)&local_c8->B + 1) = 0;
  local_b8 = 0x3ea3d70a3e4ccccd;
  uStack_b0 = 0x3ef5c28f;
  chrono::ChVisualShape::SetColor(local_c8);
  peVar1 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78 = local_c8;
  p_Stack_70 = _Stack_c0._M_pi;
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_c0._M_pi)->_M_use_count = (_Stack_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_c0._M_pi)->_M_use_count = (_Stack_c0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChPhysicsItem::AddVisualShape(peVar1,&local_78,cor_m1);
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  psVar2 = (this->props).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  size = local_48;
  for (psVar5 = (this->props).
                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                ._M_impl.super__Vector_impl_data._M_start; local_48 = size, psVar5 != psVar2;
      psVar5 = psVar5 + 1) {
    peVar1 = (psVar5->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar5->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)&local_b8,SUB81(size,0),true);
    pCVar4 = (ChColor *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size);
    chrono::ChTriangleMeshShape::ChTriangleMeshShape((ChTriangleMeshShape *)pCVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
              (&_Stack_d0,(ChTriangleMeshShape *)pCVar4);
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_ac,uStack_b0);
    lVar3 = CONCAT44(uStack_ac,uStack_b0);
    local_88 = local_b8;
    if (lVar3 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      }
    }
    chrono::ChTriangleMeshShape::SetMesh(pCVar4,&local_88,1);
    if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
    }
    *(undefined1 *)((long)&pCVar4->B + 1) = 0;
    local_40 = 0x3f2e147b3f4ccccd;
    local_38 = 0x3f051eb8;
    chrono::ChVisualShape::SetColor(pCVar4);
    p_Stack_90 = _Stack_d0._M_pi;
    if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_d0._M_pi)->_M_use_count = (_Stack_d0._M_pi)->_M_use_count + 1;
      }
    }
    local_98 = pCVar4;
    chrono::ChPhysicsItem::AddVisualShape(peVar1,&local_98,local_50);
    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
    }
    if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_ac,uStack_b0) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_ac,uStack_b0));
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    size = local_48;
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  return;
}

Assistant:

void Copter<nop>::AddVisualizationAssets(const std::string& chassismesh,
                                         const std::string& propellermesh,
                                         const ChFrame<>& cor_m1,
                                         const ChFrame<>& cor_m2) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(chassismesh, true, true);
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(trimesh);
    trimesh_shape->SetMutable(false);
    trimesh_shape->SetColor(ChColor(0.2f, 0.32f, 0.48f));
    chassis->AddVisualShape(trimesh_shape, cor_m1);

    for (auto propeller : props) {
        auto prop_trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(propellermesh, true, true);
        auto trimesh_prop_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_prop_shape->SetMesh(prop_trimesh);
        trimesh_prop_shape->SetMutable(false);
        trimesh_prop_shape->SetColor(ChColor(0.8f, 0.68f, 0.52f));
        propeller->AddVisualShape(trimesh_prop_shape, cor_m2);
    }
}